

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_> __thiscall
wasm_externtype_t::New
          (wasm_externtype_t *this,
          unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *ptr)

{
  ExternType *base;
  _func_int **in_RAX;
  FuncType *args;
  MemoryType *args_00;
  GlobalType *args_01;
  TableType *args_02;
  _func_int **local_18;
  
  base = (ptr->_M_t).
         super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
         ._M_t.
         super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
         .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  local_18 = in_RAX;
  switch(base->kind) {
  case First:
    args = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(base);
    wabt::MakeUnique<wasm_functype_t,wabt::interp::FuncType&>((wabt *)&local_18,args);
    break;
  case Table:
    args_02 = wabt::cast<wabt::interp::TableType,wabt::interp::ExternType>(base);
    wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>((wabt *)&local_18,args_02);
    break;
  case Memory:
    args_00 = wabt::cast<wabt::interp::MemoryType,wabt::interp::ExternType>(base);
    wabt::MakeUnique<wasm_memorytype_t,wabt::interp::MemoryType&>((wabt *)&local_18,args_00);
    break;
  case Global:
    args_01 = wabt::cast<wabt::interp::GlobalType,wabt::interp::ExternType>(base);
    wabt::MakeUnique<wasm_globaltype_t,wabt::interp::GlobalType&>((wabt *)&local_18,args_01);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0xc0,
                  "static std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(std::unique_ptr<ExternType>)"
                 );
  }
  this->_vptr_wasm_externtype_t = local_18;
  return (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(
    std::unique_ptr<ExternType> ptr) {
  switch (ptr->kind) {
    case ExternKind::Func:
      return MakeUnique<wasm_functype_t>(*cast<FuncType>(ptr.get()));

    case ExternKind::Table:
      return MakeUnique<wasm_tabletype_t>(*cast<TableType>(ptr.get()));

    case ExternKind::Memory:
      return MakeUnique<wasm_memorytype_t>(*cast<MemoryType>(ptr.get()));

    case ExternKind::Global:
      return MakeUnique<wasm_globaltype_t>(*cast<GlobalType>(ptr.get()));

    case ExternKind::Event:
      break;
  }

  assert(false);
  return {};
}